

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O0

ErrorMsgStream * __thiscall
spvtools::utils::(anonymous_namespace)::ErrorMsgStream::operator<<(ErrorMsgStream *this,char *val)

{
  bool bVar1;
  type pbVar2;
  char *val_local;
  ErrorMsgStream *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    pbVar2 = std::
             unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this);
    std::operator<<((ostream *)pbVar2,val);
  }
  return (ErrorMsgStream *)this;
}

Assistant:

ErrorMsgStream& operator<<(T val) {
    if (stream_) *stream_ << val;
    return *this;
  }